

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O3

void __thiscall correctness_xor_signed_Test::TestBody(correctness_xor_signed_Test *this)

{
  internal iVar1;
  bool bVar2;
  char *in_R9;
  AssertionResult gtest_ar_;
  big_integer b;
  big_integer a;
  internal local_1d8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d0;
  undefined1 local_1c8 [56];
  long *local_190 [7];
  big_integer local_158;
  big_integer local_120;
  big_integer local_e8;
  big_integer local_b0;
  big_integer local_78;
  big_integer local_40;
  
  big_integer::big_integer(&local_40,0xaa);
  big_integer::big_integer(&local_78,0xcc);
  big_integer::big_integer(&local_b0,&local_40);
  big_integer::big_integer(&local_e8,&local_78);
  big_integer::big_integer(&local_158,0x100);
  operator-((big_integer *)local_190,&local_e8,&local_158);
  operator^((big_integer *)local_1c8,&local_b0,(big_integer *)local_190);
  big_integer::big_integer(&local_120,-0x9a);
  iVar1 = (internal)operator==((big_integer *)local_1c8,&local_120);
  local_1d0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_1d8[0] = iVar1;
  big_integer::~big_integer(&local_120);
  big_integer::~big_integer((big_integer *)local_1c8);
  big_integer::~big_integer((big_integer *)local_190);
  big_integer::~big_integer(&local_158);
  big_integer::~big_integer(&local_e8);
  big_integer::~big_integer(&local_b0);
  if (!(bool)iVar1) {
    testing::Message::Message((Message *)local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1c8,local_1d8,(AssertionResult *)"(a ^ (b - 256)) == (0x66 - 256)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
               ,0x180,(char *)local_1c8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_158,(Message *)local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_158);
    if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190[0] !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190[0] !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*local_190[0] + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  big_integer::~big_integer(&local_78);
  big_integer::~big_integer(&local_40);
  return;
}

Assistant:

TEST(correctness, xor_signed)
{
    big_integer a = 0xaa;
    big_integer b = 0xcc;

    EXPECT_TRUE((a ^ (b - 256)) == (0x66 - 256));
}